

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusArcIntersect.cpp
# Opt level: O1

int GeoCalcs::LocusArcIntersect
              (Locus *locus,LLPoint *arcCenter,double arcRadius,LLPoint *intersection1,
              LLPoint *intersection2,double dTol,double dEps)

{
  bool bVar1;
  int iVar2;
  LLPoint *pLVar3;
  int iVar4;
  int iVar5;
  LLPoint LVar6;
  double newDistbase;
  double errarray [2];
  InverseResult result;
  double distarray [2];
  LLPoint intPt2;
  LLPoint intPt1;
  LLPoint perpPt;
  LLPoint intPt;
  double dDistFromPt;
  double dCrsFromPt;
  int local_13c;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  LLPoint local_f8;
  InverseResult local_e8;
  double local_c8;
  double local_c0;
  LLPoint local_b8;
  LLPoint local_a8;
  LLPoint *local_90;
  LLPoint *local_88;
  double local_80;
  LLPoint local_78;
  LLPoint local_68;
  LLPoint local_58;
  double local_40;
  double local_38;
  
  local_e8.azimuth = 0.0;
  local_e8.reverseAzimuth = 0.0;
  local_e8.distance = 0.0;
  local_100 = dEps;
  local_88 = intersection2;
  DistVincenty(&locus->locusStart,&locus->locusEnd,&local_e8);
  local_a8.latitude = 0.0;
  local_a8.longitude = 0.0;
  local_b8.latitude = 0.0;
  local_b8.longitude = 0.0;
  iVar2 = GeodesicArcIntercept
                    (&locus->locusStart,local_e8.azimuth,arcCenter,arcRadius,&local_a8,&local_b8,
                     dTol);
  iVar2 = AdjustIntersects(iVar2,locus,&local_a8,&local_b8);
  if (iVar2 == 0) {
    local_13c = 0;
  }
  else {
    local_90 = intersection1;
    DistVincenty(&locus->geoStart,&locus->geoEnd,&local_e8);
    if (iVar2 < 1) {
      local_13c = 0;
    }
    else {
      local_108 = local_e8.azimuth;
      local_13c = 0;
      iVar4 = 0;
      do {
        pLVar3 = &local_b8;
        if (iVar4 == 0) {
          pLVar3 = &local_a8;
        }
        local_58.latitude = pLVar3->latitude;
        local_58.longitude = pLVar3->longitude;
        LVar6 = PerpIntercept(&locus->geoStart,local_108,&local_58,&local_38,&local_40,dTol);
        local_68.longitude = LVar6.longitude;
        local_68.latitude = LVar6.latitude;
        DistVincenty(&local_68,&locus->geoStart,&local_e8);
        local_80 = local_e8.distance;
        LVar6 = PointOnLocusP(locus,&local_68,dTol,local_100);
        local_f8.longitude = LVar6.longitude;
        local_f8.latitude = LVar6.latitude;
        DistVincenty(&local_f8,arcCenter,&local_e8);
        local_110 = local_e8.distance - arcRadius;
        if (dTol <= ABS(local_110)) {
          local_c0 = local_80;
          local_120 = local_80 * 1.001;
          iVar5 = 0xf;
          do {
            if ((NAN(local_120)) || (ABS(local_110) <= dTol)) break;
            LVar6 = DestVincenty(&locus->geoStart,local_108,local_120);
            local_78.longitude = LVar6.longitude;
            local_78.latitude = LVar6.latitude;
            LVar6 = PointOnLocusP(locus,&local_78,dTol,local_100);
            local_f8.longitude = LVar6.longitude;
            local_f8.latitude = LVar6.latitude;
            DistVincenty(&local_f8,arcCenter,&local_e8);
            local_c8 = local_c0;
            local_c0 = local_120;
            local_118 = local_110;
            local_110 = local_e8.distance - arcRadius;
            FindLinearRoot(&local_c8,&local_118,&local_120);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        bVar1 = PtIsOnLocus(locus,&local_f8,1e-06);
        if (bVar1) {
          pLVar3 = &local_a8;
          if ((iVar4 == 0) || (pLVar3 = &local_b8, iVar4 == 1)) {
            pLVar3->latitude = local_f8.latitude;
            pLVar3->longitude = local_f8.longitude;
          }
          local_13c = local_13c + 1;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != iVar2);
    }
    local_90->latitude = local_a8.latitude;
    local_90->longitude = local_a8.longitude;
    local_88->latitude = local_b8.latitude;
    local_88->longitude = local_b8.longitude;
    DistVincenty(local_90,local_88,&local_e8);
    if ((iVar2 == 2) && (ABS(local_e8.distance) < 5e-09)) {
      local_13c = 1;
    }
  }
  return local_13c;
}

Assistant:

int LocusArcIntersect(const Locus &locus, const LLPoint &arcCenter, double arcRadius,
                          LLPoint &intersection1, LLPoint &intersection2, double dTol,
                          double dEps)
    {
        int nIntersections = 0;

        InverseResult result;
        DistVincenty(locus.locusStart, locus.locusEnd, result);

        LLPoint intPt1, intPt2;

        const int nIntersects = AdjustIntersects(GeodesicArcIntercept(locus.locusStart, result.azimuth,
                                                                      arcCenter, arcRadius, intPt1, intPt2,
                                                                      dTol),
                                                 locus, intPt1, intPt2);

        if (nIntersects == 0)
            return 0;

        DistVincenty(locus.geoStart, locus.geoEnd, result);
        const double gcrs = result.azimuth;

        for (int i = 0; i < nIntersects; i++)
        {
            LLPoint intPt = i == 0 ? intPt1 : intPt2;
            double dCrsFromPt, dDistFromPt;
            LLPoint perpPt = PerpIntercept(locus.geoStart, gcrs, intPt, dCrsFromPt, dDistFromPt, dTol);

            DistVincenty(perpPt, locus.geoStart, result);
            const double distbase = result.distance;

            LLPoint locPt = PointOnLocusP(locus, perpPt, dTol, dEps);

            DistVincenty(locPt, arcCenter, result);

            double errarray[2], distarray[2];
            errarray[1] = result.distance - arcRadius;

            if (fabs(errarray[1]) >= dTol)
            {
                distarray[1] = distbase;
                const int maxCount = 15;
                double newDistbase = 1.001 * distbase;
                int k = 0;
                while (k < maxCount && !std::isnan(newDistbase) && fabs(errarray[1]) > dTol)
                {
                    locPt = PointOnLocusP(locus, DestVincenty(locus.geoStart, gcrs, newDistbase),
                                          dTol, dEps);
                    DistVincenty(locPt, arcCenter, result);

                    distarray[0] = distarray[1];
                    distarray[1] = newDistbase;
                    errarray[0] = errarray[1];
                    errarray[1] = result.distance - arcRadius;

                    FindLinearRoot(distarray, errarray, newDistbase);
                    k++;
                }
            }

            if (PtIsOnLocus(locus, locPt, 1e-6)) //dTol))
            {
                if (i == 0)
                    intPt1 = locPt;
                else if (i == 1)
                    intPt2 = locPt;
                nIntersections++;
            }
        }
        intersection1 = intPt1;
        intersection2 = intPt2;
        DistVincenty(intersection1, intersection2, result);
        if (nIntersects == 2 && IsNearZero(result.distance, 0.5e-8))
        {
            nIntersections = 1;
        }

        return nIntersections;
    }